

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O1

ON_SubDComponentRef *
ON_SubDComponentRef::Create
          (ON_SubDComponentRef *__return_storage_ptr__,ON_SubDRef *subd_ref,
          ON_SubDComponentPtr component_ptr,ON_SubDComponentLocation component_location,
          ON__UINT_PTR reference_id)

{
  ON_SubDRef *this;
  ON_COMPONENT_INDEX *this_00;
  int iVar1;
  Type TVar2;
  bool bVar3;
  ON_SubDComponentRef component_ref;
  ON_SubDComponentPtr local_78;
  ON_SubDComponentRef local_70;
  
  local_78.m_ptr = component_ptr.m_ptr;
  ON_Object::ON_Object((ON_Object *)&local_70);
  local_70.super_ON_Geometry.super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00829458;
  this = &local_70.m_subd_ref;
  ON_SubDRef::ON_SubDRef(this);
  local_70.m_component_ptr = (ON_SubDComponentPtr)0;
  local_70.m_component_index = ON_COMPONENT_INDEX::UnsetComponentIndex;
  local_70.m_component_location = Unset;
  local_70.m_reference_id = 0;
  if (this != subd_ref) {
    local_70.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (subd_ref->m_subd_sp).super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_70.m_subd_ref.m_subd_sp.
                super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(subd_ref->m_subd_sp).super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  local_70.m_reference_id = reference_id;
  TVar2 = ON_SubDComponentPtr::ComponentType(&local_78);
  this_00 = &local_70.m_component_index;
  if (TVar2 == Vertex) {
    if (((local_78.m_ptr & 0xfffffffffffffff8) != 0) &&
       (iVar1 = *(int *)((local_78.m_ptr & 0xfffffffffffffff8) + 8), 1 < iVar1 + 1U)) {
      local_70.m_component_ptr.m_ptr = local_78.m_ptr;
      ON_COMPONENT_INDEX::Set(this_00,subd_vertex,iVar1);
      local_70.m_component_location = component_location;
      goto LAB_006356a5;
    }
  }
  else if (TVar2 == Edge) {
    if (((local_78.m_ptr & 0xfffffffffffffff8) != 0) &&
       (iVar1 = *(int *)((local_78.m_ptr & 0xfffffffffffffff8) + 8), 1 < iVar1 + 1U)) {
      local_70.m_component_ptr.m_ptr = local_78.m_ptr;
      ON_COMPONENT_INDEX::Set(this_00,subd_edge,iVar1);
      local_70.m_component_location = component_location;
      goto LAB_006356a5;
    }
  }
  else if (TVar2 == Face) {
    if (((local_78.m_ptr & 0xfffffffffffffff8) != 0) &&
       (iVar1 = *(int *)((local_78.m_ptr & 0xfffffffffffffff8) + 8), 1 < iVar1 + 1U)) {
      local_70.m_component_ptr.m_ptr = local_78.m_ptr;
      ON_COMPONENT_INDEX::Set(this_00,subd_face,iVar1);
      local_70.m_component_location = component_location;
      goto LAB_006356a5;
    }
  }
  else {
    bVar3 = ON_SubDComponentPtr::IsNull(&local_78);
    if (bVar3) goto LAB_006356a5;
  }
  ON_SubDIncrementErrorCount();
LAB_006356a5:
  ON_SubDComponentRef(__return_storage_ptr__,&local_70);
  local_70.super_ON_Geometry.super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00829458;
  ON_SubDRef::~ON_SubDRef(this);
  ON_Object::~ON_Object((ON_Object *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentRef ON_SubDComponentRef::Create(
  const ON_SubDRef& subd_ref,
  ON_SubDComponentPtr component_ptr,
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
  )
{
  ON_SubDComponentRef component_ref;
  component_ref.m_subd_ref = subd_ref;
  component_ref.m_reference_id = reference_id;
  bool bValidInput = false;
  switch (component_ptr.ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = ON_SUBD_VERTEX_POINTER(component_ptr.m_ptr);
      if (nullptr != vertex && vertex->m_id > 0 && vertex->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_vertex,(int)vertex->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(component_ptr.m_ptr);
      if (nullptr != edge && edge->m_id > 0 && edge->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_edge,(int)edge->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = ON_SUBD_FACE_POINTER(component_ptr.m_ptr);
      if (nullptr != face && face->m_id > 0 && face->m_id < ON_UNSET_UINT_INDEX)
      {
        component_ref.m_component_ptr = component_ptr;
        component_ref.m_component_index.Set(ON_COMPONENT_INDEX::TYPE::subd_face,(int)face->m_id);
        component_ref.m_component_location = component_location;
        bValidInput = true;
      }
    }
    break;
  default:
    if ( component_ptr.IsNull() )
      bValidInput = true;
  }

  if (bValidInput)
  {
    return component_ref;
  }

  return ON_SUBD_RETURN_ERROR(component_ref);
}